

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_set_tiledesc(exr_context_t ctxt,int part_index,char *name,exr_attr_tiledesc_t *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_box2i_t *peVar1;
  uint32_t uVar2;
  int iVar3;
  exr_result_t eVar4;
  char *pcVar5;
  exr_context_t nonc;
  char *pcVar6;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  if ((name != (char *)0x0) && (iVar3 = strcmp(name,"tiles"), iVar3 == 0)) {
    if (val == (exr_attr_tiledesc_t *)0x0) {
      return 3;
    }
    eVar4 = exr_set_tile_descriptor
                      (ctxt,part_index,val->x_size,val->y_size,val->level_and_round & 0xf,
                       (uint)(val->level_and_round >> 4));
    return eVar4;
  }
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar4 = (*ctxt->print_error)(ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index);
    return eVar4;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar4 = 0x15;
LAB_001241d0:
    eVar4 = (*ctxt->standard_error)(ctxt,eVar4);
    return eVar4;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar4 = 8;
    goto LAB_001241d0;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar4 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar4 == 0) {
    eVar4 = 0;
    if (local_38->type != EXR_ATTR_TILEDESC) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar6 = local_38->type_name;
      pcVar5 = "\'%s\' requested type \'tiledesc\', but stored attributes is type \'%s\'";
      eVar4 = 0x10;
      goto LAB_001242c5;
    }
  }
  else {
    if (eVar4 != 0xf) goto LAB_00124278;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar4 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,&local_38);
  }
  if (val != (exr_attr_tiledesc_t *)0x0) {
    if (eVar4 == 0) {
      peVar1 = (local_38->field_6).box2i;
      *(uint8_t *)&(peVar1->max).x = val->level_and_round;
      uVar2 = val->y_size;
      (peVar1->min).x = val->x_size;
      (peVar1->min).y = uVar2;
    }
LAB_00124278:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return eVar4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pcVar5 = "No input value for setting \'%s\', type \'%s\'";
  pcVar6 = "tiledesc";
  eVar4 = 3;
LAB_001242c5:
  eVar4 = (*ctxt->print_error)(ctxt,eVar4,pcVar5,name,pcVar6);
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_set_tiledesc (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    const exr_attr_tiledesc_t* val)
{
    if (name && 0 == strcmp (name, EXR_REQ_TILES_STR))
    {
        if (!val) return EXR_ERR_INVALID_ARGUMENT;
        return exr_set_tile_descriptor (
            ctxt,
            part_index,
            val->x_size,
            val->y_size,
            EXR_GET_TILE_LEVEL_MODE (*val),
            EXR_GET_TILE_ROUND_MODE (*val));
    }

    {
        ATTR_SET_IMPL_DEREF (EXR_ATTR_TILEDESC, tiledesc);
    }
}